

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O2

void __thiscall cmInstallScriptGenerator::GenerateScript(cmInstallScriptGenerator *this,ostream *os)

{
  ostream *poVar1;
  Indent indent;
  string component_test;
  cmScriptGeneratorIndent local_40;
  cmScriptGeneratorIndent local_3c;
  string local_38;
  
  local_40.Level = 0;
  cmInstallGenerator::CreateComponentTest_abi_cxx11_
            (&local_38,&this->super_cmInstallGenerator,
             (this->super_cmInstallGenerator).Component._M_dataplus._M_p);
  cmScriptGeneratorIndent::Write(&local_40,os);
  poVar1 = std::operator<<(os,"if(");
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::operator<<(poVar1,")\n");
  if (this->Code == true) {
    local_3c.Level = local_40.Level + 2;
    cmScriptGeneratorIndent::Write(&local_3c,os);
    poVar1 = std::operator<<(os,(string *)&this->Script);
    std::operator<<(poVar1,"\n");
  }
  else {
    local_3c.Level = local_40.Level + 2;
    cmScriptGeneratorIndent::Write(&local_3c,os);
    poVar1 = std::operator<<(os,"include(\"");
    poVar1 = std::operator<<(poVar1,(string *)&this->Script);
    std::operator<<(poVar1,"\")\n");
  }
  cmScriptGeneratorIndent::Write(&local_40,os);
  std::operator<<(os,"endif()\n\n");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmInstallScriptGenerator::GenerateScript(std::ostream& os)
{
  Indent indent;
  std::string component_test =
    this->CreateComponentTest(this->Component.c_str());
  os << indent << "if(" << component_test << ")\n";

  if(this->Code)
    {
    os << indent.Next() << this->Script << "\n";
    }
  else
    {
    os << indent.Next() << "include(\"" << this->Script << "\")\n";
    }

  os << indent << "endif()\n\n";
}